

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O2

int xmlC14NProcessNodeList(xmlC14NCtxPtr ctx,xmlNodePtr cur)

{
  xmlC14NMode xVar1;
  xmlC14NVisibleNsStackPtr p_Var2;
  xmlNode *node;
  bool bVar3;
  xmlNodePtr pxVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  xmlChar *pxVar9;
  xmlChar **ppxVar10;
  xmlNodePtr pxVar11;
  xmlNodePtr pxVar12;
  xmlListPtr l;
  xmlAttrPtr pxVar13;
  _xmlNs *str;
  _xmlNs *base;
  void *pvVar14;
  byte bVar15;
  uint *ns;
  undefined7 uVar16;
  char *in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *extraout_RDX_15;
  char *extraout_RDX_16;
  char *extraout_RDX_17;
  char *pcVar17;
  long lVar18;
  _xmlNode *p_Var19;
  _xmlNode **pp_Var20;
  _xmlAttr **pp_Var21;
  int iVar22;
  xmlNs *pxVar23;
  bool bVar24;
  xmlNodePtr local_b0;
  _xmlNs *local_a8;
  xmlNodePtr local_a0;
  int local_8c;
  xmlNs ns_default;
  undefined8 local_48;
  
  iVar6 = 0;
LAB_0015c24a:
  iVar5 = 1;
  if ((cur == (xmlNodePtr)0x0) || (iVar6 < 0)) {
    return iVar6;
  }
  if (ctx->is_visible_callback != (xmlC14NIsVisibleCallback)0x0) {
    iVar5 = (*ctx->is_visible_callback)(ctx->user_data,cur,cur->parent);
    in_RDX = extraout_RDX;
  }
  iVar22 = 0;
  ns = &switchD_0015c299::switchdataD_001c40c0;
  iVar6 = 0;
  switch(cur->type) {
  case XML_ELEMENT_NODE:
    pxVar23 = (xmlNs *)&cur->nsDef;
    while (pxVar23 = pxVar23->next, pxVar23 != (xmlNs *)0x0) {
      iVar6 = xmlStrlen(pxVar23->href);
      if (0 < iVar6) {
        iVar6 = xmlParseURISafe((char *)pxVar23->href,(xmlURIPtr *)&ns_default);
        if (ns_default.next == (_xmlNs *)0x0) {
          if (iVar6 < 0) goto LAB_0015cb88;
          xmlC14NErr(ctx,cur,0x5b,"parsing namespace uri");
          in_RDX = extraout_RDX_05;
          goto LAB_0015c4de;
        }
        ns = (uint *)ns_default.next;
        iVar6 = xmlStrlen((xmlChar *)(ns_default.next)->next);
        if (iVar6 == 0) {
          xmlC14NErrFull(ctx,(xmlNodePtr)0x0,0x7a3,(char *)(ns_default.next)->next,
                         "Relative namespace UR is invalid here : %s\n",(ns_default.next)->next);
          xmlFreeURI((xmlURIPtr)ns_default.next);
          in_RDX = extraout_RDX_06;
          goto LAB_0015c4de;
        }
        xmlFreeURI((xmlURIPtr)ns_default.next);
      }
    }
    p_Var2 = ctx->ns_rendered;
    if (p_Var2 == (xmlC14NVisibleNsStackPtr)0x0) {
      iVar22 = 0;
      xmlC14NErrParam((xmlC14NCtxPtr)0x0);
      local_48 = 0;
    }
    else {
      local_48._0_4_ = p_Var2->nsCurEnd;
      local_48._4_4_ = p_Var2->nsPrevStart;
      iVar22 = p_Var2->nsPrevEnd;
    }
    if (iVar5 == 0) {
      local_8c = 0;
    }
    else {
      local_8c = ctx->parent_is_doc;
      if (local_8c != 0) {
        ctx->pos = XMLC14N_INSIDE_DOCUMENT_ELEMENT;
        ctx->parent_is_doc = 0;
      }
      xmlOutputBufferWriteString(ctx->buf,"<");
      if ((cur->ns != (xmlNs *)0x0) && (iVar6 = xmlStrlen(cur->ns->prefix), 0 < iVar6)) {
        xmlOutputBufferWriteString(ctx->buf,(char *)cur->ns->prefix);
        xmlOutputBufferWriteString(ctx->buf,":");
      }
      xmlOutputBufferWriteString(ctx->buf,(char *)cur->name);
    }
    if (ctx->mode != XML_C14N_EXCLUSIVE_1_0) {
      if (cur->type != XML_ELEMENT_NODE) goto LAB_0015cb78;
      local_b0 = (xmlNodePtr)xmlListCreate((xmlListDeallocator)0x0,xmlC14NNsCompare);
      if (local_b0 == (xmlNodePtr)0x0) goto LAB_0015cb88;
      local_a8 = (_xmlNs *)0x0;
      for (p_Var19 = cur; p_Var19 != (xmlNodePtr)0x0; p_Var19 = p_Var19->parent) {
        pxVar11 = (xmlNodePtr)&p_Var19->nsDef;
        while (pxVar11 = (xmlNodePtr)pxVar11->_private, pxVar11 != (xmlNodePtr)0x0) {
          pxVar12 = (xmlNodePtr)xmlSearchNs(cur->doc,cur,(xmlChar *)pxVar11->children);
          if (((pxVar12 == pxVar11) && (iVar6 = xmlC14NIsXmlNs((xmlNsPtr)pxVar11), iVar6 == 0)) &&
             ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0 ||
              (iVar6 = (*ctx->is_visible_callback)(ctx->user_data,pxVar11,cur), iVar6 != 0)))) {
            iVar6 = xmlC14NVisibleNsStackFind(ctx->ns_rendered,(xmlNsPtr)pxVar11);
            if ((iVar5 != 0) &&
               (iVar7 = xmlC14NVisibleNsStackAdd(ctx->ns_rendered,(xmlNsPtr)pxVar11,cur), iVar7 < 0)
               ) goto LAB_0015c94e;
            if (iVar6 == 0) {
              xmlListInsert((xmlListPtr)local_b0,pxVar11);
            }
            iVar6 = xmlStrlen((xmlChar *)pxVar11->children);
            ns = (uint *)local_a8;
            if (iVar6 == 0) {
              ns = (uint *)0x1;
              local_a8 = (_xmlNs *)ns;
            }
          }
        }
      }
      if ((iVar5 != 0) && ((int)local_a8 == 0)) {
LAB_0015ca97:
        ns_default._private = (void *)0x0;
        ns_default.context = (_xmlDoc *)0x0;
        ns_default.href = (xmlChar *)0x0;
        ns_default.prefix = (xmlChar *)0x0;
        ns_default.next = (_xmlNs *)0x0;
        ns_default.type = 0;
        ns_default._12_4_ = 0;
        iVar6 = xmlC14NVisibleNsStackFind(ctx->ns_rendered,&ns_default);
joined_r0x0015cbc0:
        if (iVar6 == 0) {
          xmlC14NPrintNamespaces(&ns_default,ctx);
        }
      }
LAB_0015cac8:
      xmlListWalk((xmlListPtr)local_b0,xmlC14NPrintNamespacesWalker,ctx);
      goto LAB_0015cada;
    }
    if (cur->type != XML_ELEMENT_NODE) goto LAB_0015cb78;
    local_b0 = (xmlNodePtr)xmlListCreate((xmlListDeallocator)0x0,xmlC14NNsCompare);
    if (local_b0 != (xmlNodePtr)0x0) {
      ppxVar10 = ctx->inclusive_ns_prefixes;
      if (ppxVar10 == (xmlChar **)0x0) {
        local_a0._0_4_ = 0;
        bVar24 = false;
      }
      else {
        lVar18 = 0;
        local_a0 = (xmlNodePtr)0x0;
        bVar24 = false;
        while( true ) {
          pxVar9 = *(xmlChar **)((long)ppxVar10 + lVar18);
          if (pxVar9 == (xmlChar *)0x0) break;
          iVar6 = xmlStrEqual(pxVar9,(xmlChar *)"#default");
          if ((iVar6 != 0) || (iVar6 = xmlStrEqual(pxVar9,""), iVar6 != 0)) {
            bVar24 = true;
            pxVar9 = (xmlChar *)0x0;
          }
          pxVar11 = (xmlNodePtr)xmlSearchNs(cur->doc,cur,pxVar9);
          if (((pxVar11 != (xmlNodePtr)0x0) &&
              (iVar6 = xmlC14NIsXmlNs((xmlNsPtr)pxVar11), iVar6 == 0)) &&
             ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0 ||
              (iVar6 = (*ctx->is_visible_callback)(ctx->user_data,pxVar11,cur), iVar6 != 0)))) {
            iVar6 = xmlC14NVisibleNsStackFind(ctx->ns_rendered,(xmlNsPtr)pxVar11);
            if ((iVar5 != 0) &&
               (iVar7 = xmlC14NVisibleNsStackAdd(ctx->ns_rendered,(xmlNsPtr)pxVar11,cur), iVar7 < 0)
               ) goto LAB_0015c94e;
            if (iVar6 == 0) {
              xmlListInsert((xmlListPtr)local_b0,pxVar11);
            }
            iVar6 = xmlStrlen((xmlChar *)pxVar11->children);
            ns = (uint *)local_a0;
            if (iVar6 == 0) {
              ns = (uint *)0x1;
              local_a0 = (xmlNodePtr)ns;
            }
          }
          ppxVar10 = ctx->inclusive_ns_prefixes;
          lVar18 = lVar18 + 8;
        }
      }
      bVar3 = false;
      pxVar11 = (xmlNodePtr)cur->ns;
      if (pxVar11 == (xmlNodePtr)0x0) {
        pxVar11 = (xmlNodePtr)xmlSearchNs(cur->doc,cur,(xmlChar *)0x0);
        bVar3 = true;
        if (pxVar11 != (xmlNodePtr)0x0) goto LAB_0015c8d6;
        bVar3 = true;
LAB_0015c972:
        pp_Var20 = (_xmlNode **)&cur->properties;
        while (pxVar11 = *pp_Var20, pxVar11 != (xmlNodePtr)0x0) {
          if (pxVar11->ns != (xmlNsPtr)0x0) {
            iVar6 = xmlC14NIsXmlNs(pxVar11->ns);
            if ((iVar6 == 0) &&
               ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0 ||
                (iVar6 = (*ctx->is_visible_callback)(ctx->user_data,pxVar11,cur), iVar6 != 0)))) {
              iVar6 = xmlExcC14NVisibleNsStackFind(ctx->ns_rendered,pxVar11->ns,ctx);
              iVar7 = xmlC14NVisibleNsStackAdd(ctx->ns_rendered,pxVar11->ns,cur);
              if (iVar7 < 0) {
                xmlC14NErrMemory(ctx);
                goto LAB_0015cada;
              }
              if ((iVar5 != 0) && (iVar6 == 0)) {
                xmlListInsert((xmlListPtr)local_b0,pxVar11->ns);
              }
              iVar6 = xmlStrlen(pxVar11->ns->prefix);
              if (iVar6 == 0) {
                local_a0._0_4_ = 1;
              }
            }
            else if ((pxVar11->ns != (xmlNs *)0x0) &&
                    ((iVar6 = xmlStrlen(pxVar11->ns->prefix), iVar6 == 0 &&
                     (iVar6 = xmlStrlen(pxVar11->ns->href), iVar6 == 0)))) {
              bVar3 = true;
            }
          }
          pp_Var20 = &pxVar11->next;
        }
        uVar16 = (undefined7)((ulong)ns >> 8);
        ns = (uint *)CONCAT71(uVar16,!bVar3 || iVar5 == 0);
        if (((int)local_a0 == 0 && !bVar24) && (bVar3 && iVar5 != 0)) {
          ns_default._private = (void *)0x0;
          ns_default.context = (_xmlDoc *)0x0;
          ns_default.href = (xmlChar *)0x0;
          ns_default.prefix = (xmlChar *)0x0;
          ns_default.next = (_xmlNs *)0x0;
          ns_default.type = 0;
          ns_default._12_4_ = 0;
          iVar6 = xmlExcC14NVisibleNsStackFind(ctx->ns_rendered,&ns_default,ctx);
          goto joined_r0x0015cbc0;
        }
        bVar15 = (iVar5 != 0 && (int)local_a0 == 0) & bVar24;
        ns = (uint *)CONCAT71(uVar16,bVar15);
        if (bVar15 == 1) goto LAB_0015ca97;
        goto LAB_0015cac8;
      }
LAB_0015c8d6:
      iVar6 = xmlC14NIsXmlNs((xmlNsPtr)pxVar11);
      if (iVar6 != 0) goto LAB_0015c972;
      if (iVar5 == 0) {
LAB_0015c938:
        iVar6 = xmlStrlen((xmlChar *)pxVar11->children);
        if (iVar6 == 0) {
          local_a0._0_4_ = 1;
        }
        goto LAB_0015c972;
      }
      if (((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
          (iVar6 = (*ctx->is_visible_callback)(ctx->user_data,pxVar11,cur), iVar6 != 0)) &&
         (iVar6 = xmlExcC14NVisibleNsStackFind(ctx->ns_rendered,(xmlNsPtr)pxVar11,ctx), iVar6 == 0))
      {
        xmlListInsert((xmlListPtr)local_b0,pxVar11);
      }
      iVar6 = xmlC14NVisibleNsStackAdd(ctx->ns_rendered,(xmlNsPtr)pxVar11,cur);
      if (-1 < iVar6) goto LAB_0015c938;
      xmlC14NErrMemory(ctx);
      goto LAB_0015cada;
    }
    goto LAB_0015cb88;
  case XML_ATTRIBUTE_NODE:
    pcVar17 = "XML_ATTRIBUTE_NODE";
    goto LAB_0015c4d9;
  case XML_TEXT_NODE:
  case XML_CDATA_SECTION_NODE:
    iVar6 = iVar22;
    if ((iVar5 != 0) && (cur->content != (xmlChar *)0x0)) {
      pxVar9 = xmlC11NNormalizeString(cur->content,XMLC14N_NORMALIZE_TEXT);
      if (pxVar9 == (xmlChar *)0x0) {
        xmlC14NErrMemory(ctx);
        in_RDX = extraout_RDX_04;
      }
      else {
        xmlOutputBufferWriteString(ctx->buf,(char *)pxVar9);
        (*xmlFree)(pxVar9);
        in_RDX = extraout_RDX_01;
      }
      iVar6 = -(uint)(pxVar9 == (xmlChar *)0x0);
    }
    break;
  case XML_ENTITY_REF_NODE:
    pcVar17 = "XML_ENTITY_REF_NODE";
    goto LAB_0015c4d9;
  case XML_ENTITY_NODE:
    pcVar17 = "XML_ENTITY_NODE";
    goto LAB_0015c4d9;
  case XML_PI_NODE:
    iVar6 = iVar22;
    if (iVar5 != 0) {
      pcVar17 = "<?";
      if (ctx->pos == XMLC14N_AFTER_DOCUMENT_ELEMENT) {
        pcVar17 = "\n<?";
      }
      xmlOutputBufferWriteString(ctx->buf,pcVar17);
      xmlOutputBufferWriteString(ctx->buf,(char *)cur->name);
      if ((cur->content != (xmlChar *)0x0) && (*cur->content != '\0')) {
        xmlOutputBufferWriteString(ctx->buf," ");
        pxVar9 = xmlC11NNormalizeString(cur->content,XMLC14N_NORMALIZE_PI);
        if (pxVar9 == (xmlChar *)0x0) {
LAB_0015c581:
          xmlC14NErrMemory(ctx);
          in_RDX = extraout_RDX_08;
          goto LAB_0015c4de;
        }
        xmlOutputBufferWriteString(ctx->buf,(char *)pxVar9);
        (*xmlFree)(pxVar9);
      }
      if (ctx->pos == XMLC14N_BEFORE_DOCUMENT_ELEMENT) {
        pcVar17 = "?>\n";
      }
      else {
        pcVar17 = "?>";
      }
      xmlOutputBufferWriteString(ctx->buf,pcVar17);
      in_RDX = extraout_RDX_07;
    }
    break;
  case XML_COMMENT_NODE:
    iVar6 = iVar22;
    if ((iVar5 != 0) && (ctx->with_comments != 0)) {
      pcVar17 = "<!--";
      if (ctx->pos == XMLC14N_AFTER_DOCUMENT_ELEMENT) {
        pcVar17 = "\n<!--";
      }
      xmlOutputBufferWriteString(ctx->buf,pcVar17);
      if (cur->content != (xmlChar *)0x0) {
        pxVar9 = xmlC11NNormalizeString(cur->content,XMLC14N_NORMALIZE_COMMENT);
        if (pxVar9 == (xmlChar *)0x0) goto LAB_0015c581;
        xmlOutputBufferWriteString(ctx->buf,(char *)pxVar9);
        (*xmlFree)(pxVar9);
      }
      if (ctx->pos == XMLC14N_BEFORE_DOCUMENT_ELEMENT) {
        pcVar17 = "-->\n";
      }
      else {
        pcVar17 = "-->";
      }
      xmlOutputBufferWriteString(ctx->buf,pcVar17);
      in_RDX = extraout_RDX_09;
    }
    break;
  case XML_DOCUMENT_NODE:
  case XML_DOCUMENT_FRAG_NODE:
  case XML_HTML_DOCUMENT_NODE:
    pxVar11 = cur->children;
    if (pxVar11 != (xmlNodePtr)0x0) {
      ctx->pos = XMLC14N_BEFORE_DOCUMENT_ELEMENT;
      ctx->parent_is_doc = 1;
      iVar6 = xmlC14NProcessNodeList(ctx,pxVar11);
      in_RDX = extraout_RDX_00;
    }
    break;
  case XML_DOCUMENT_TYPE_NODE:
  case XML_NOTATION_NODE:
  case XML_DTD_NODE:
  case XML_ELEMENT_DECL:
  case XML_ATTRIBUTE_DECL:
  case XML_ENTITY_DECL:
  case XML_XINCLUDE_START:
  case XML_XINCLUDE_END:
    break;
  case XML_NAMESPACE_DECL:
    pcVar17 = "XML_NAMESPACE_DECL";
LAB_0015c4d9:
    xmlC14NErrInvalidNode(ctx,pcVar17,in_RDX);
    in_RDX = extraout_RDX_03;
    goto LAB_0015c4de;
  default:
    xmlC14NErrFull(ctx,(xmlNodePtr)0x0,0x7a2,"processing node","Unknown node type %d found : %s\n",
                   (ulong)cur->type,"processing node");
    in_RDX = extraout_RDX_02;
    goto LAB_0015c4de;
  }
  goto switchD_0015c299_caseD_a;
LAB_0015c94e:
  xmlC14NErrMemory(ctx);
LAB_0015cada:
  xmlListDelete((xmlListPtr)local_b0);
  if (iVar5 != 0) {
    p_Var2 = ctx->ns_rendered;
    if (p_Var2 == (xmlC14NVisibleNsStackPtr)0x0) {
      xmlC14NErrParam((xmlC14NCtxPtr)0x0);
    }
    else {
      ns = (uint *)(ulong)(uint)p_Var2->nsCurEnd;
      p_Var2->nsPrevStart = p_Var2->nsPrevEnd;
      p_Var2->nsPrevEnd = p_Var2->nsCurEnd;
    }
  }
  if (cur->type == XML_ELEMENT_NODE) {
    l = xmlListCreate((xmlListDeallocator)0x0,xmlC14NAttrsCompare);
    if (l != (xmlListPtr)0x0) {
      xVar1 = ctx->mode;
      if (xVar1 == XML_C14N_1_1) {
        local_a0 = (xmlNodePtr)0x0;
        local_b0 = (xmlNodePtr)0x0;
        pxVar11 = (xmlNodePtr)0x0;
        pp_Var20 = (_xmlNode **)&cur->properties;
        while (pxVar12 = *pp_Var20, pxVar12 != (xmlNodePtr)0x0) {
          if ((iVar5 == 0) || (iVar6 = xmlC14NIsXmlAttr((xmlAttrPtr)pxVar12), iVar6 == 0)) {
LAB_0015ccdc:
            if ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
               (iVar6 = (*ctx->is_visible_callback)(ctx->user_data,pxVar12,cur), pxVar4 = local_b0,
               iVar6 != 0)) {
              xmlListInsert(l,pxVar12);
              pxVar4 = local_b0;
            }
          }
          else if ((local_b0 != (xmlNodePtr)0x0) ||
                  (iVar6 = xmlStrEqual(pxVar12->name,"lang"), pxVar4 = pxVar12, iVar6 == 0)) {
            if (pxVar11 == (xmlNodePtr)0x0) {
              iVar6 = xmlStrEqual(pxVar12->name,"space");
              bVar24 = iVar6 == 0;
              pxVar11 = (xmlNodePtr)0x0;
              if (!bVar24) {
                pxVar11 = pxVar12;
              }
              ns = (uint *)CONCAT71((int7)((ulong)ns >> 8),bVar24);
              if (!bVar24 || local_a0 != (xmlNodePtr)0x0) {
                pxVar11 = pxVar12;
                pxVar4 = local_b0;
                if (iVar6 == 0) {
                  pxVar11 = (xmlNodePtr)0x0;
                  goto LAB_0015ccdc;
                }
                goto LAB_0015cd02;
              }
            }
            else if (local_a0 != (xmlNodePtr)0x0) goto LAB_0015ccdc;
            iVar6 = xmlStrEqual(pxVar12->name,"base");
            pxVar4 = local_b0;
            local_a0 = pxVar12;
            if (iVar6 == 0) {
              local_a0 = (xmlNodePtr)0x0;
              goto LAB_0015ccdc;
            }
          }
LAB_0015cd02:
          local_b0 = pxVar4;
          pp_Var20 = &pxVar12->next;
        }
        if (iVar5 != 0) {
          if ((local_b0 != (xmlNodePtr)0x0) ||
             (local_b0 = (xmlNodePtr)
                         xmlC14NFindHiddenParentAttr(ctx,cur->parent,"lang",(xmlChar *)ns),
             local_b0 != (xmlNodePtr)0x0)) {
            xmlListInsert(l,local_b0);
          }
          if ((pxVar11 != (xmlNodePtr)0x0) ||
             (pxVar11 = (xmlNodePtr)
                        xmlC14NFindHiddenParentAttr(ctx,cur->parent,"space",(xmlChar *)ns),
             pxVar11 != (xmlNodePtr)0x0)) {
            xmlListInsert(l,pxVar11);
          }
          if ((local_a0 != (xmlNodePtr)0x0) ||
             (local_a0 = (xmlNodePtr)
                         xmlC14NFindHiddenParentAttr(ctx,cur->parent,"base",(xmlChar *)ns),
             local_a0 != (xmlNodePtr)0x0)) {
            if (local_a0->parent != (_xmlNode *)0x0) {
              local_b0 = (xmlNodePtr)xmlNodeListGetString(ctx->doc,local_a0->children,1);
              if (local_b0 != (xmlNodePtr)0x0) {
                pp_Var20 = &local_a0->parent->parent;
LAB_0015cdd0:
                do {
                  node = *pp_Var20;
                  if (((node == (xmlNode *)0x0) ||
                      (ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0)) ||
                     (iVar6 = (*ctx->is_visible_callback)(ctx->user_data,node,node->parent),
                     iVar6 != 0)) goto LAB_0015cfc3;
                  pp_Var20 = &node->parent;
                  pxVar13 = xmlHasNsProp(node,"base",
                                         (xmlChar *)"http://www.w3.org/XML/1998/namespace");
                } while (pxVar13 == (xmlAttrPtr)0x0);
                str = (_xmlNs *)xmlNodeListGetString(ctx->doc,pxVar13->children,1);
                if (str == (_xmlNs *)0x0) {
                  (*xmlFree)(local_b0);
                }
                else {
                  uVar8 = xmlStrlen((xmlChar *)str);
                  base = str;
                  if ((((int)uVar8 < 2) || (*(xmlChar *)((long)str + ((ulong)uVar8 - 2)) != '.')) ||
                     (ns_default.next = (_xmlNs *)xmlStrcat((xmlChar *)str,"/"),
                     base = ns_default.next, ns_default.next != (_xmlNs *)0x0)) {
                    iVar6 = xmlBuildURISafe((xmlChar *)local_b0,(xmlChar *)base,
                                            (xmlChar **)&ns_default);
                    (*xmlFree)(base);
                    (*xmlFree)(local_b0);
                    if (iVar6 != 0) {
                      if (iVar6 < 0) {
                        xmlC14NErrMemory(ctx);
                      }
                      else {
                        xmlC14NErr(ctx,node,0x5b,
                                   "processing xml:base attribute - can\'t construct uri");
                      }
                      goto LAB_0015d051;
                    }
                    local_b0 = (xmlNodePtr)ns_default.next;
                    goto LAB_0015cdd0;
                  }
                  (*xmlFree)(str);
                  (*xmlFree)(local_b0);
                }
                xmlC14NErrMemory(ctx);
                goto LAB_0015d051;
              }
              goto LAB_0015d049;
            }
            xmlC14NErrParam(ctx);
          }
          goto LAB_0015d051;
        }
LAB_0015cf76:
        xmlListWalk(l,xmlC14NPrintAttrs,ctx);
        xmlFreePropList((xmlAttrPtr)0x0);
        xmlListDelete(l);
        in_RDX = extraout_RDX_12;
      }
      else {
        if (xVar1 == XML_C14N_EXCLUSIVE_1_0) {
          pp_Var20 = (_xmlNode **)&cur->properties;
          while (pxVar11 = *pp_Var20, pxVar11 != (xmlNodePtr)0x0) {
            if ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
               (iVar6 = (*ctx->is_visible_callback)(ctx->user_data,pxVar11,cur), iVar6 != 0)) {
              xmlListInsert(l,pxVar11);
            }
            pp_Var20 = &pxVar11->next;
          }
LAB_0015d051:
          pxVar13 = (xmlAttrPtr)0x0;
        }
        else {
          if (xVar1 != XML_C14N_1_0) goto LAB_0015d051;
          pp_Var20 = (_xmlNode **)&cur->properties;
          while (pxVar11 = *pp_Var20, pxVar11 != (xmlNodePtr)0x0) {
            if ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
               (iVar6 = (*ctx->is_visible_callback)(ctx->user_data,pxVar11,cur), iVar6 != 0)) {
              xmlListInsert(l,pxVar11);
            }
            pp_Var20 = &pxVar11->next;
          }
          if (iVar5 == 0) goto LAB_0015cf76;
          pxVar11 = cur->parent;
          if (pxVar11 == (xmlNodePtr)0x0) {
            pxVar13 = (xmlAttrPtr)0x0;
          }
          else {
            if ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
               (iVar6 = (*ctx->is_visible_callback)(ctx->user_data,pxVar11,pxVar11->parent),
               p_Var19 = cur, iVar6 != 0)) goto LAB_0015d051;
            while (p_Var19 = p_Var19->parent, p_Var19 != (_xmlNode *)0x0) {
              pp_Var21 = &p_Var19->properties;
              while (pxVar13 = *pp_Var21, pxVar13 != (xmlAttrPtr)0x0) {
                iVar6 = xmlC14NIsXmlAttr(pxVar13);
                if ((iVar6 != 0) && (pvVar14 = xmlListSearch(l,pxVar13), pvVar14 == (void *)0x0)) {
                  xmlListInsert(l,pxVar13);
                }
                pp_Var21 = &pxVar13->next;
              }
            }
            pxVar13 = (xmlAttrPtr)0x0;
          }
        }
LAB_0015d054:
        xmlListWalk(l,xmlC14NPrintAttrs,ctx);
        xmlFreePropList(pxVar13);
        xmlListDelete(l);
        in_RDX = extraout_RDX_13;
        if (iVar5 != 0) {
          xmlOutputBufferWriteString(ctx->buf,">");
          in_RDX = extraout_RDX_14;
        }
      }
      if (cur->children != (xmlNodePtr)0x0) {
        iVar7 = xmlC14NProcessNodeList(ctx,cur->children);
        iVar6 = -1;
        in_RDX = extraout_RDX_15;
        if (iVar7 < 0) goto switchD_0015c299_caseD_a;
      }
      if (iVar5 != 0) {
        xmlOutputBufferWriteString(ctx->buf,"</");
        if ((cur->ns != (xmlNs *)0x0) && (iVar6 = xmlStrlen(cur->ns->prefix), 0 < iVar6)) {
          xmlOutputBufferWriteString(ctx->buf,(char *)cur->ns->prefix);
          xmlOutputBufferWriteString(ctx->buf,":");
        }
        xmlOutputBufferWriteString(ctx->buf,(char *)cur->name);
        xmlOutputBufferWriteString(ctx->buf,">");
        in_RDX = extraout_RDX_16;
        if (local_8c != 0) {
          ctx->parent_is_doc = local_8c;
          ctx->pos = XMLC14N_AFTER_DOCUMENT_ELEMENT;
        }
      }
      p_Var2 = ctx->ns_rendered;
      if (p_Var2 == (xmlC14NVisibleNsStackPtr)0x0) {
        iVar6 = 0;
        xmlC14NErrParam((xmlC14NCtxPtr)0x0);
        in_RDX = extraout_RDX_17;
      }
      else {
        p_Var2->nsCurEnd = (undefined4)local_48;
        p_Var2->nsPrevStart = local_48._4_4_;
        p_Var2->nsPrevEnd = iVar22;
        iVar6 = 0;
      }
      goto switchD_0015c299_caseD_a;
    }
LAB_0015cb88:
    xmlC14NErrMemory(ctx);
    in_RDX = extraout_RDX_11;
  }
  else {
LAB_0015cb78:
    xmlC14NErrParam(ctx);
    in_RDX = extraout_RDX_10;
  }
LAB_0015c4de:
  iVar6 = -1;
switchD_0015c299_caseD_a:
  cur = cur->next;
  goto LAB_0015c24a;
LAB_0015cfc3:
  if ((local_b0 == (xmlNodePtr)0x0) || (iVar6 = xmlStrEqual((xmlChar *)local_b0,""), iVar6 != 0)) {
    (*xmlFree)(local_b0);
  }
  else {
    pxVar13 = xmlNewNsProp((xmlNodePtr)0x0,local_a0->ns,"base",(xmlChar *)local_b0);
    (*xmlFree)(local_b0);
    if (pxVar13 != (xmlAttrPtr)0x0) {
      xmlListInsert(l,pxVar13);
      pxVar13->next = (_xmlAttr *)0x0;
      goto LAB_0015d054;
    }
LAB_0015d049:
    xmlC14NErrMemory(ctx);
  }
  goto LAB_0015d051;
}

Assistant:

static int
xmlC14NProcessNodeList(xmlC14NCtxPtr ctx, xmlNodePtr cur)
{
    int ret;

    if (ctx == NULL) {
        xmlC14NErrParam(ctx);
        return (-1);
    }

    for (ret = 0; cur != NULL && ret >= 0; cur = cur->next) {
        ret = xmlC14NProcessNode(ctx, cur);
    }
    return (ret);
}